

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_unit.cc
# Opt level: O3

void __thiscall pstack::Dwarf::Unit::Unit(Unit *this,Info *di,DWARFReader *r)

{
  _Rb_tree_header *p_Var1;
  Off *pOVar2;
  uintmax_t uVar3;
  Off OVar4;
  Exception *this_00;
  Off OVar5;
  size_t len;
  pair<unsigned_long,_unsigned_long> pVar6;
  undefined1 local_1c8 [8];
  uchar q [2];
  
  (this->super_enable_shared_from_this<pstack::Dwarf::Unit>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<pstack::Dwarf::Unit>)._M_weak_this.
  super___weak_ptr<pstack::Dwarf::Unit,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->abbreviations)._M_h._M_buckets = &(this->abbreviations)._M_h._M_single_bucket;
  (this->abbreviations)._M_h._M_bucket_count = 1;
  (this->abbreviations)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->abbreviations)._M_h._M_element_count = 0;
  (this->abbreviations)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->abbreviations)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->abbreviations)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->allEntries)._M_t._M_impl.super__Rb_tree_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allEntries)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->abbrevOffset = 0;
  (this->lines)._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::LineInfo,_std::default_delete<pstack::Dwarf::LineInfo>_>._M_t
  .super__Tuple_impl<0UL,_pstack::Dwarf::LineInfo_*,_std::default_delete<pstack::Dwarf::LineInfo>_>.
  super__Head_base<0UL,_pstack::Dwarf::LineInfo_*,_false>._M_head_impl = (LineInfo *)0x0;
  (this->macros)._M_t.
  super___uniq_ptr_impl<pstack::Dwarf::Macros,_std::default_delete<pstack::Dwarf::Macros>_>._M_t.
  super__Tuple_impl<0UL,_pstack::Dwarf::Macros_*,_std::default_delete<pstack::Dwarf::Macros>_>.
  super__Head_base<0UL,_pstack::Dwarf::Macros_*,_false>._M_head_impl = (Macros *)0x0;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->rangesForOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->dwarf = di;
  this->unitType = DW_UT_compile;
  *(undefined8 *)(this->id)._M_elems = 0;
  this->offset = r->off;
  pVar6 = DWARFReader::getlength(r);
  this->length = (uint)pVar6.first;
  this->dwarfLen = pVar6.second;
  OVar5 = r->off;
  this->end = (uint)pVar6.first + OVar5;
  Reader::readObj<unsigned_char>
            ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             OVar5,local_1c8,2);
  pOVar2 = &this->abbrevOffset;
  OVar5 = r->off + 2;
  r->off = OVar5;
  this->version = local_1c8._0_2_;
  if ((ushort)local_1c8._0_2_ < 3) {
    this->dwarfLen = 8;
    len = 4;
  }
  else {
    if (4 < (ushort)local_1c8._0_2_) {
      Reader::readObj<unsigned_char>
                ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,OVar5,local_1c8,1);
      OVar5 = r->off + 1;
      r->off = OVar5;
      this->unitType = (uint)(byte)local_1c8[0];
      if ((byte)local_1c8[0] - 4 < 3) {
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,OVar5,local_1c8,1);
        r->off = r->off + 1;
        this->addrlen = (uint8_t)local_1c8[0];
        r->addrLen = (uint)(byte)local_1c8[0];
        uVar3 = DWARFReader::getuint(r,this->dwarfLen);
        *pOVar2 = uVar3;
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,r->off,(this->id)._M_elems,8);
        OVar4 = r->off + 8;
        r->off = OVar4;
      }
      else {
        if (2 < (byte)local_1c8[0] - DW_UT_compile) {
          this_00 = (Exception *)__cxa_allocate_exception(0x1a0);
          memset((Exception *)local_1c8,0,0x1a0);
          Exception::Exception((Exception *)local_1c8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)q,"unhandled DW_UT_ unit type value ",0x21);
          std::ostream::operator<<((ostream *)q,this->unitType);
          Exception::Exception(this_00,(Exception *)local_1c8);
          __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
        }
        Reader::readObj<unsigned_char>
                  ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,OVar5,local_1c8,1);
        r->off = r->off + 1;
        this->addrlen = (uint8_t)local_1c8[0];
        r->addrLen = (uint)(byte)local_1c8[0];
        uVar3 = DWARFReader::getuint(r,this->dwarfLen);
        *pOVar2 = uVar3;
        OVar4 = r->off;
      }
      goto LAB_0014343a;
    }
    len = this->dwarfLen;
  }
  uVar3 = DWARFReader::getuint(r,len);
  *pOVar2 = uVar3;
  Reader::readObj<unsigned_char>
            ((r->io).super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             r->off,local_1c8,1);
  OVar4 = r->off + 1;
  r->off = OVar4;
  this->addrlen = (uint8_t)local_1c8[0];
  r->addrLen = (uint)(byte)local_1c8[0];
LAB_0014343a:
  this->rootOffset = OVar4;
  return;
}

Assistant:

Unit::Unit(const Info *di, DWARFReader &r)
    : abbrevOffset{ 0 }
    , dwarf(di)
    , unitType(DW_UT_compile)
    , id{}
{
    offset = r.getOffset();
    std::tie(length, dwarfLen) = r.getlength();
    end = r.getOffset() + length;
    version = r.getu16();

    if (version <= 2) // DWARF Version 2 uses the architecture's address size.
       dwarfLen = ELF_BYTES;
    if (version >= 5) {
        unitType = UnitType(r.getu8());
        switch (unitType) {
        case DW_UT_compile:
        case DW_UT_type:
        case DW_UT_partial:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            break;
        case DW_UT_skeleton:
        case DW_UT_split_compile:
        case DW_UT_split_type:
            r.addrLen = addrlen = r.getu8();
            abbrevOffset = r.getuint(dwarfLen);
            r.getBytes(sizeof id, &id[0]);
            break;
        default:
            throw (Exception() << "unhandled DW_UT_ unit type value " << unitType);
        }
    } else {
        abbrevOffset = r.getuint(version <= 2 ? 4 : dwarfLen);
        r.addrLen = addrlen = r.getu8();
    }
    rootOffset = r.getOffset();
    // we now have enough info to parse the abbreviations and the DIE tree.
}